

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cc
# Opt level: O0

int __thiscall RpcClient::PollResponse(RpcClient *this)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  element_type *peVar3;
  ostream *stream;
  long in_RDI;
  shared_ptr<RpcMessage> response;
  unsigned_long_long ticket;
  int size;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffff48;
  NarpcStaging *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  NarpcStaging *in_stack_ffffffffffffff70;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  NarpcStaging *in_stack_ffffffffffffffd0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  NarpcStaging::Clear(in_stack_ffffffffffffff50);
  NarpcStaging::FetchHeader
            (in_stack_ffffffffffffff70,iVar1,in_stack_ffffffffffffff60,
             (unsigned_long_long *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  poVar2 = std::operator<<((ostream *)&std::cout,"receiving size ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2,", ticket ");
  this_00 = (void *)std::ostream::operator<<(poVar2,0);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<RpcMessage>::shared_ptr
            ((shared_ptr<RpcMessage> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  NarpcStaging::Clear(in_stack_ffffffffffffff50);
  stream = (ostream *)(in_RDI + 0x20);
  std::shared_ptr<RpcMessage>::shared_ptr
            ((shared_ptr<RpcMessage> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  NarpcStaging::FetchMessage
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x178350);
  poVar2 = std::operator<<((ostream *)&std::cout,"RpcMessage::PollResponse ");
  std::shared_ptr<RpcMessage>::shared_ptr
            ((shared_ptr<RpcMessage> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  poVar2 = operator<<(stream,(shared_ptr<RpcMessage> *)poVar2);
  poVar2 = std::operator<<(poVar2," (size ");
  peVar3 = std::__shared_ptr_access<RpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<RpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1783bc);
  iVar1 = (*peVar3->_vptr_RpcMessage[3])();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x178416);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x178423);
  return 0;
}

Assistant:

int RpcClient::PollResponse() {
  // stream_.Clear();
  staging_.Clear();

  // recv narpc header
  // stream_.Read(socket_, kNarpcHeader);

  // int msg_size = stream_.GetInt();
  // long long msg_ticket = stream_.GetLong();
  int size = 0;
  unsigned long long ticket = 0;
  staging_.FetchHeader(socket_, size, ticket);

  cout << "receiving size " << size << ", ticket " << ticket << endl;
  shared_ptr<RpcMessage> response = responseMap_[ticket];

  // stream_.Read(socket_, msg_size);
  // msg_response->Update(stream_);
  staging_.Clear();
  staging_.FetchMessage(socket_, response);
  cout << "RpcMessage::PollResponse " << response << " (size "
       << response->Size() << ")" << endl;

  return 0;
}